

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  byte *pbVar15;
  byte *pbVar16;
  longdouble in_ST0;
  double dVar17;
  int local_64;
  
  *pResult = 0.0;
  if (length != 0) {
    if (enc == '\x01') {
      lVar10 = 1;
      iVar11 = 1;
      pbVar16 = (byte *)z;
    }
    else {
      iVar11 = 1;
      for (lVar10 = (long)(int)(3 - (uint)enc); lVar10 < (int)(length & 0xfffffffe);
          lVar10 = lVar10 + 2) {
        if (z[lVar10] != '\0') {
          iVar11 = -100;
          break;
        }
      }
      length = (uint)lVar10 ^ 1;
      pbVar16 = (byte *)(z + (enc & 1));
      lVar10 = 2;
    }
    pbVar15 = (byte *)(z + length);
    for (; pbVar16 < pbVar15; pbVar16 = pbVar16 + lVar10) {
      bVar2 = *pbVar16;
      if ((""[bVar2] & 1) == 0) {
        lVar9 = 0;
        lVar8 = 0;
        if ((bVar2 - 0x2b & 0xfd) == 0) {
          lVar8 = lVar10;
        }
        pbVar16 = pbVar16 + lVar8;
        local_64 = 1;
        iVar7 = 0;
        iVar14 = 0;
        iVar12 = 0;
        goto LAB_00132183;
      }
    }
  }
  return 0;
LAB_00132183:
  bVar6 = 1;
  if (pbVar16 < pbVar15) {
    bVar3 = *pbVar16;
    if (0xfffffffffffffff5 < (ulong)bVar3 - 0x3a) {
      lVar9 = lVar9 * 10 + (long)(char)bVar3 + -0x30;
      pbVar16 = pbVar16 + lVar10;
      iVar14 = iVar14 + 1;
      if (0xcccccccccccccca < lVar9) {
        for (; (pbVar16 < pbVar15 && (0xfffffffffffffff5 < (ulong)*pbVar16 - 0x3a));
            pbVar16 = pbVar16 + lVar10) {
          iVar7 = iVar7 + 1;
        }
      }
      goto LAB_00132183;
    }
    if (bVar3 == 0x2e) {
      iVar11 = iVar11 + 1;
      while ((pbVar1 = pbVar16 + lVar10, pbVar1 < pbVar15 &&
             (0xfffffffffffffff5 < (ulong)*pbVar1 - 0x3a))) {
        pbVar16 = pbVar1;
        if (lVar9 < 0xccccccccccccccb) {
          lVar9 = lVar9 * 10 + (long)(char)*pbVar1 + -0x30;
          iVar7 = iVar7 + -1;
          iVar14 = iVar14 + 1;
        }
      }
      pbVar16 = pbVar16 + lVar10;
    }
    iVar12 = 0;
    local_64 = 1;
    if (pbVar16 < pbVar15) {
      if ((*pbVar16 | 0x20) == 0x65) {
        pbVar16 = pbVar16 + lVar10;
        iVar11 = iVar11 + 1;
        if (pbVar15 <= pbVar16) {
          iVar12 = 0;
          local_64 = 1;
          bVar6 = 0;
          goto LAB_001322d9;
        }
        local_64 = 1;
        if (*pbVar16 == 0x2b) {
          pbVar16 = pbVar16 + lVar10;
        }
        else {
          local_64 = 1;
          if (*pbVar16 == 0x2d) {
            pbVar16 = pbVar16 + lVar10;
            local_64 = -1;
          }
        }
        iVar12 = 0;
        bVar6 = 0;
        for (; (pbVar16 < pbVar15 && (0xfffffffffffffff5 < (ulong)*pbVar16 - 0x3a));
            pbVar16 = pbVar16 + lVar10) {
          bVar4 = 9999 < iVar12;
          iVar12 = iVar12 * 10 + -0x30 + (int)(char)*pbVar16;
          if (bVar4) {
            iVar12 = 10000;
          }
          bVar6 = 1;
        }
      }
      else {
        bVar6 = 1;
        iVar12 = 0;
        local_64 = 1;
      }
      while ((pbVar16 < pbVar15 && ((""[*pbVar16] & 1) != 0))) {
        pbVar16 = pbVar16 + lVar10;
      }
    }
  }
LAB_001322d9:
  if (lVar9 == 0) {
    if (bVar2 == 0x2d) {
      dVar17 = -0.0;
    }
    else {
      dVar17 = 0.0;
    }
    goto LAB_001323de;
  }
  uVar13 = iVar12 * local_64 + iVar7;
  uVar5 = -uVar13;
  if (0 < (int)uVar13) {
    uVar5 = uVar13;
  }
  do {
    if ((int)uVar5 < 1) {
      lVar10 = -lVar9;
      if (bVar2 != 0x2d) {
        lVar10 = lVar9;
      }
      if (uVar5 == 0) {
        dVar17 = (double)lVar10;
        goto LAB_001323de;
      }
LAB_0013239e:
      sqlite3Pow10((longdouble *)(ulong)uVar5,-0x33333335);
      if ((int)uVar13 < 0) {
        in_ST0 = (longdouble)lVar10 / in_ST0;
      }
      else {
        in_ST0 = (longdouble)lVar10 * in_ST0;
      }
      dVar17 = (double)in_ST0;
LAB_001323de:
      *pResult = dVar17;
      if ((bool)((0 < iVar14 && pbVar16 == pbVar15) & bVar6 & 0 < iVar11)) {
        return iVar11;
      }
      if ((1 < iVar11) && ((bool)((bVar6 | iVar11 == 3) & 0 < iVar14))) {
        return -1;
      }
      return 0;
    }
    if ((int)uVar13 < 0) {
      lVar10 = lVar9 / 10;
      if (lVar9 % 10 != 0) goto LAB_00132342;
    }
    else {
      if (0xccccccccccccccb < lVar9) {
LAB_00132342:
        lVar10 = -lVar9;
        if (bVar2 != 0x2d) {
          lVar10 = lVar9;
        }
        if (0x133 < uVar5) {
          if (uVar5 < 0x156) {
            sqlite3Pow10((longdouble *)(ulong)(uVar5 - 0x134),-0x33333335);
            if ((int)uVar13 < 0) {
              dVar17 = (double)((longdouble)lVar10 / in_ST0) / 1e+308;
            }
            else {
              dVar17 = (double)((longdouble)lVar10 * in_ST0) * 1e+308;
            }
          }
          else if ((int)uVar13 < 0) {
            dVar17 = (double)((ulong)(double)lVar10 & 0x8000000000000000);
          }
          else {
            dVar17 = (double)((float)lVar10 * INFINITY);
          }
          goto LAB_001323de;
        }
        goto LAB_0013239e;
      }
      lVar10 = lVar9 * 10;
    }
    lVar9 = lVar10;
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_INT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}